

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall
btSoftBody::appendAnchor
          (btSoftBody *this,int node,btRigidBody *body,btVector3 *localPivot,
          bool disableCollisionBetweenLinkedBodies,btScalar influence)

{
  undefined1 *puVar1;
  Node *pNVar2;
  int iVar3;
  undefined3 in_register_00000081;
  Anchor a;
  Anchor local_90;
  
  if (CONCAT31(in_register_00000081,disableCollisionBetweenLinkedBodies) != 0) {
    local_90.m_node = (Node *)body;
    iVar3 = btAlignedObjectArray<const_btCollisionObject_*>::findLinearSearch
                      (&this->m_collisionDisabledObjects,(btCollisionObject **)&local_90);
    if (iVar3 == (this->m_collisionDisabledObjects).m_size) {
      local_90.m_node = (Node *)body;
      btAlignedObjectArray<const_btCollisionObject_*>::push_back
                (&this->m_collisionDisabledObjects,(btCollisionObject **)&local_90);
    }
  }
  pNVar2 = (this->m_nodes).m_data;
  local_90.m_node = pNVar2 + node;
  local_90.m_local.m_floats._0_8_ = *(undefined8 *)localPivot->m_floats;
  local_90.m_local.m_floats._8_8_ = *(undefined8 *)(localPivot->m_floats + 2);
  puVar1 = &pNVar2[node].field_0x70;
  *puVar1 = *puVar1 | 1;
  local_90.m_body = body;
  local_90.m_influence = influence;
  btAlignedObjectArray<btSoftBody::Anchor>::push_back(&this->m_anchors,&local_90);
  return;
}

Assistant:

void			btSoftBody::appendAnchor(int node,btRigidBody* body, const btVector3& localPivot,bool disableCollisionBetweenLinkedBodies,btScalar influence)
{
	if (disableCollisionBetweenLinkedBodies)
	{
		if (m_collisionDisabledObjects.findLinearSearch(body)==m_collisionDisabledObjects.size())
		{
			m_collisionDisabledObjects.push_back(body);
		}
	}

	Anchor	a;
	a.m_node			=	&m_nodes[node];
	a.m_body			=	body;
	a.m_local			=	localPivot;
	a.m_node->m_battach	=	1;
	a.m_influence = influence;
	m_anchors.push_back(a);
}